

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::ResultBuilder::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,ResultBuilder *this)

{
  string *psVar1;
  string *__lhs;
  string *__rhs;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &bStack_128;
  psVar1 = &(this->m_exprComponents).op;
  bVar2 = std::operator==(psVar1,"");
  if (!bVar2) {
    bVar2 = std::operator==(psVar1,"matches");
    if (bVar2) {
      std::operator+(&bStack_128,&(this->m_exprComponents).lhs," ");
      std::operator+(__return_storage_ptr__,&bStack_128,&(this->m_exprComponents).rhs);
    }
    else {
      bVar2 = std::operator!=(psVar1,"!");
      if (bVar2) {
        __lhs = &(this->m_exprComponents).lhs;
        __rhs = &(this->m_exprComponents).rhs;
        if ((((this->m_exprComponents).rhs._M_string_length +
              (this->m_exprComponents).lhs._M_string_length < 0x28) &&
            (lVar3 = std::__cxx11::string::find((char *)__lhs,0x16b5b8), lVar3 == -1)) &&
           (lVar3 = std::__cxx11::string::find((char *)__rhs,0x16b5b8), lVar3 == -1)) {
          std::operator+(&local_e8,__lhs," ");
          std::operator+(&local_108,&local_e8,psVar1);
          std::operator+(&bStack_128,&local_108," ");
          std::operator+(__return_storage_ptr__,&bStack_128,__rhs);
        }
        else {
          std::operator+(&local_e8,__lhs,"\n");
          std::operator+(&local_108,&local_e8,psVar1);
          std::operator+(&bStack_128,&local_108,"\n");
          std::operator+(__return_storage_ptr__,&bStack_128,__rhs);
        }
        std::__cxx11::string::~string((string *)&bStack_128);
        std::__cxx11::string::~string((string *)&local_108);
        this_00 = &local_e8;
      }
      else {
        std::operator+(&local_48,"{can\'t expand - use ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        std::operator+(&local_a8,&local_48,"_FALSE( ");
        psVar1 = &(this->m_assertionInfo).capturedExpression;
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)psVar1);
        std::operator+(&local_88,&local_a8,&local_c8);
        std::operator+(&local_68,&local_88," ) instead of ");
        std::operator+(&local_e8,&local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        std::operator+(&local_108,&local_e8,"( ");
        std::operator+(&bStack_128,&local_108,psVar1);
        std::operator+(__return_storage_ptr__,&bStack_128," ) for better diagnostics}");
        std::__cxx11::string::~string((string *)&bStack_128);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        this_00 = &local_48;
      }
    }
    std::__cxx11::string::~string((string *)this_00);
    return __return_storage_ptr__;
  }
  if ((this->m_exprComponents).lhs._M_string_length != 0) {
    std::operator+(__return_storage_ptr__,psVar1,&(this->m_exprComponents).lhs);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&(this->m_assertionInfo).capturedExpression)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string ResultBuilder::reconstructExpression() const {
        if( m_exprComponents.op == "" )
            return m_exprComponents.lhs.empty() ? m_assertionInfo.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
        else if( m_exprComponents.op == "matches" )
            return m_exprComponents.lhs + " " + m_exprComponents.rhs;
        else if( m_exprComponents.op != "!" ) {
            if( m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 40 &&
                m_exprComponents.lhs.find("\n") == std::string::npos &&
                m_exprComponents.rhs.find("\n") == std::string::npos )
                return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
            else
                return m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs;
        }
        else
            return "{can't expand - use " + m_assertionInfo.macroName + "_FALSE( " + m_assertionInfo.capturedExpression.substr(1) + " ) instead of " + m_assertionInfo.macroName + "( " + m_assertionInfo.capturedExpression + " ) for better diagnostics}";
    }